

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KuhnAlgorithm.cpp
# Opt level: O1

bool __thiscall BoxNesting::KuhnAlgorithm::kuhn(KuhnAlgorithm *this,int16_t vertex)

{
  short sVar1;
  short vertex_00;
  _Bit_type *p_Var2;
  pointer pvVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  short sVar7;
  undefined6 in_register_00000032;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  
  uVar4 = CONCAT62(in_register_00000032,vertex) & 0xffffffff;
  uVar10 = (ulong)(int)CONCAT62(in_register_00000032,vertex);
  uVar5 = uVar10 + 0x3f;
  if (-1 < (long)uVar10) {
    uVar5 = uVar10;
  }
  p_Var2 = (this->used).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p;
  uVar6 = (ulong)((uVar10 & 0x800000000000003f) < 0x8000000000000001);
  uVar9 = p_Var2[((long)uVar5 >> 6) + uVar6 + 0xffffffffffffffff];
  if ((uVar9 >> ((ulong)(ushort)vertex & 0x3f) & 1) == 0) {
    p_Var2[((long)uVar5 >> 6) + uVar6 + 0xffffffffffffffff] = uVar9 | 1L << ((byte)uVar4 & 0x3f);
    pvVar3 = (this->graph).
             super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar8 = (long)*(pointer *)
                   ((long)&pvVar3[uVar10].super__Vector_base<short,_std::allocator<short>_>._M_impl
                   + 8) -
            *(long *)&pvVar3[uVar10].super__Vector_base<short,_std::allocator<short>_>._M_impl;
    bVar11 = lVar8 != 0;
    if (bVar11) {
      uVar9 = lVar8 >> 1;
      sVar7 = 1;
      uVar5 = 0;
      do {
        sVar1 = *(short *)(*(long *)&(this->graph).
                                     super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[uVar10].
                                     super__Vector_base<short,_std::allocator<short>_>._M_impl +
                          uVar5 * 2);
        vertex_00 = (this->pairsRight).super__Vector_base<short,_std::allocator<short>_>._M_impl.
                    super__Vector_impl_data._M_start[sVar1];
        if ((vertex_00 == -1) || (bVar11 = kuhn(this,vertex_00), bVar11)) {
          (this->pairsRight).super__Vector_base<short,_std::allocator<short>_>._M_impl.
          super__Vector_impl_data._M_start[sVar1] = (short)uVar4;
          (this->pairsLeft).super__Vector_base<short,_std::allocator<short>_>._M_impl.
          super__Vector_impl_data._M_start[uVar10] = sVar1;
          return true;
        }
        uVar5 = (ulong)sVar7;
        sVar7 = sVar7 + 1;
        bVar11 = uVar5 < uVar9;
      } while (uVar5 < uVar9);
    }
  }
  else {
    bVar11 = false;
  }
  return bVar11;
}

Assistant:

bool KuhnAlgorithm::kuhn(int16_t vertex) const
{
	if (this->used[vertex]) {
		return false;
	}
	this->used[vertex] = true;

	auto sz = this->graph[vertex].size();
	for (int16_t i = 0; i < sz; ++i) {
		auto to = this->graph[vertex][i];
		if (this->pairsRight[to] == -1 || kuhn(this->pairsRight[to])) {
			this->pairsRight[to] = vertex;
			this->pairsLeft[vertex] = to;
			return true;
		}
	}
	return false;
}